

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcryptohash-sha2-512.c
# Opt level: O3

void p_crypto_hash_sha2_512_update(PHashSHA2_512 *ctx,puchar *data,psize len)

{
  puint64 *ppVar1;
  ulong uVar2;
  short sVar3;
  short sVar4;
  short sVar5;
  short sVar6;
  short sVar7;
  short sVar8;
  short sVar9;
  short sVar10;
  short sVar11;
  short sVar12;
  short sVar13;
  short sVar14;
  short sVar15;
  short sVar16;
  short sVar17;
  short sVar18;
  undefined1 auVar19 [15];
  undefined1 auVar20 [15];
  undefined1 auVar21 [15];
  undefined1 auVar22 [15];
  undefined1 auVar23 [15];
  undefined1 auVar24 [15];
  undefined1 auVar25 [15];
  undefined1 auVar26 [15];
  undefined1 auVar27 [15];
  undefined1 auVar28 [15];
  undefined1 auVar29 [15];
  undefined1 auVar30 [15];
  undefined1 auVar31 [15];
  undefined1 auVar32 [15];
  undefined1 auVar33 [15];
  undefined1 auVar34 [15];
  undefined1 auVar35 [11];
  undefined1 auVar36 [15];
  undefined1 auVar37 [11];
  undefined1 auVar38 [15];
  undefined1 auVar39 [15];
  undefined1 auVar40 [15];
  undefined1 auVar41 [15];
  uint uVar42;
  long lVar43;
  ulong __n;
  undefined1 auVar44 [16];
  undefined1 auVar45 [11];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [11];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar46 [15];
  undefined1 auVar50 [15];
  
  uVar2 = ctx->len_low;
  uVar42 = (uint)uVar2 & 0x7f;
  ctx->len_low = uVar2 + len;
  if (CARRY8(uVar2,len)) {
    ctx->len_high = ctx->len_high + 1;
  }
  if ((uVar2 & 0x7f) != 0) {
    __n = (ulong)(0x80 - uVar42);
    if (len < __n) goto LAB_00113be6;
    memcpy((void *)((long)ctx->hash + ((ulong)((uint)uVar2 & 0x7f) - 0x80)),data,__n);
    lVar43 = 0;
    do {
      auVar47 = *(undefined1 (*) [16])(ctx->hash + lVar43 + -0x10);
      auVar52[8] = auVar47[8];
      auVar52[9] = 0;
      auVar52[10] = auVar47[9];
      auVar49._0_10_ = (unkuint10)auVar47[0xc] << 0x40;
      auVar49[10] = auVar47[0xd];
      auVar50[0xb] = 0;
      auVar50._0_11_ = auVar49;
      auVar50[0xc] = auVar47[0xe];
      auVar50[0xd] = 0;
      auVar50[0xe] = auVar47[0xf];
      auVar52[3] = 0;
      auVar52._0_3_ = auVar49._8_3_;
      auVar52._4_3_ = auVar50._12_3_;
      auVar52[7] = 0;
      auVar52[0xb] = 0;
      auVar52._12_3_ = (int3)(CONCAT16(auVar47[0xb],(uint6)auVar47[10] << 0x20) >> 0x20);
      auVar52[0xf] = 0;
      auVar51 = pshuflw(auVar52,auVar52,0x1b);
      auVar52 = pshufhw(auVar51,auVar51,0x1b);
      auVar19[0xd] = 0;
      auVar19._0_13_ = auVar47._0_13_;
      auVar19[0xe] = auVar47[7];
      auVar20[0xc] = auVar47[6];
      auVar20._0_12_ = auVar47._0_12_;
      auVar20._13_2_ = auVar19._13_2_;
      auVar22[0xb] = 0;
      auVar22._0_11_ = auVar47._0_11_;
      auVar22._12_3_ = auVar20._12_3_;
      auVar24[10] = auVar47[5];
      auVar24._0_10_ = auVar47._0_10_;
      auVar24._11_4_ = auVar22._11_4_;
      auVar26[9] = 0;
      auVar26._0_9_ = auVar47._0_9_;
      auVar26._10_5_ = auVar24._10_5_;
      auVar28[8] = auVar47[4];
      auVar28._0_8_ = auVar47._0_8_;
      auVar28._9_6_ = auVar26._9_6_;
      auVar51[7] = 0;
      auVar51._0_7_ = auVar28._8_7_;
      auVar34._7_8_ = 0;
      auVar34._0_7_ = auVar28._8_7_;
      auVar38._1_8_ = SUB158(auVar34 << 0x40,7);
      auVar38[0] = auVar47[3];
      auVar38._9_6_ = 0;
      auVar35._1_10_ = SUB1510(auVar38 << 0x30,5);
      auVar35[0] = auVar47[2];
      auVar39._11_4_ = 0;
      auVar39._0_11_ = auVar35;
      auVar31[2] = auVar47[1];
      auVar31._0_2_ = auVar47._0_2_;
      auVar31._3_12_ = SUB1512(auVar39 << 0x20,3);
      auVar32._2_13_ = auVar31._2_13_;
      auVar32._0_2_ = auVar47._0_2_ & 0xff;
      auVar51._8_4_ = auVar32._0_4_;
      auVar51._12_4_ = auVar35._0_4_;
      auVar47 = pshuflw(auVar51,auVar51,0x1b);
      auVar47 = pshufhw(auVar47,auVar47,0x1b);
      sVar3 = auVar47._0_2_;
      sVar4 = auVar47._2_2_;
      sVar5 = auVar47._4_2_;
      sVar6 = auVar47._6_2_;
      sVar7 = auVar47._8_2_;
      sVar8 = auVar47._10_2_;
      sVar9 = auVar47._12_2_;
      sVar10 = auVar47._14_2_;
      sVar11 = auVar52._0_2_;
      sVar12 = auVar52._2_2_;
      sVar13 = auVar52._4_2_;
      sVar14 = auVar52._6_2_;
      sVar15 = auVar52._8_2_;
      sVar16 = auVar52._10_2_;
      sVar17 = auVar52._12_2_;
      sVar18 = auVar52._14_2_;
      ppVar1 = ctx->hash + lVar43 + -0x10;
      *(char *)ppVar1 = (0 < sVar3) * (sVar3 < 0x100) * auVar47[0] - (0xff < sVar3);
      *(char *)((long)ppVar1 + 1) = (0 < sVar4) * (sVar4 < 0x100) * auVar47[2] - (0xff < sVar4);
      *(char *)((long)ppVar1 + 2) = (0 < sVar5) * (sVar5 < 0x100) * auVar47[4] - (0xff < sVar5);
      *(char *)((long)ppVar1 + 3) = (0 < sVar6) * (sVar6 < 0x100) * auVar47[6] - (0xff < sVar6);
      *(char *)((long)ppVar1 + 4) = (0 < sVar7) * (sVar7 < 0x100) * auVar47[8] - (0xff < sVar7);
      *(char *)((long)ppVar1 + 5) = (0 < sVar8) * (sVar8 < 0x100) * auVar47[10] - (0xff < sVar8);
      *(char *)((long)ppVar1 + 6) = (0 < sVar9) * (sVar9 < 0x100) * auVar47[0xc] - (0xff < sVar9);
      *(char *)((long)ppVar1 + 7) = (0 < sVar10) * (sVar10 < 0x100) * auVar47[0xe] - (0xff < sVar10)
      ;
      *(char *)(ppVar1 + 1) = (0 < sVar11) * (sVar11 < 0x100) * auVar52[0] - (0xff < sVar11);
      *(char *)((long)ppVar1 + 9) = (0 < sVar12) * (sVar12 < 0x100) * auVar52[2] - (0xff < sVar12);
      *(char *)((long)ppVar1 + 10) = (0 < sVar13) * (sVar13 < 0x100) * auVar52[4] - (0xff < sVar13);
      *(char *)((long)ppVar1 + 0xb) = (0 < sVar14) * (sVar14 < 0x100) * auVar52[6] - (0xff < sVar14)
      ;
      *(char *)((long)ppVar1 + 0xc) = (0 < sVar15) * (sVar15 < 0x100) * auVar52[8] - (0xff < sVar15)
      ;
      *(char *)((long)ppVar1 + 0xd) =
           (0 < sVar16) * (sVar16 < 0x100) * auVar52[10] - (0xff < sVar16);
      *(char *)((long)ppVar1 + 0xe) =
           (0 < sVar17) * (sVar17 < 0x100) * auVar52[0xc] - (0xff < sVar17);
      *(char *)((long)ppVar1 + 0xf) =
           (0 < sVar18) * (sVar18 < 0x100) * auVar52[0xe] - (0xff < sVar18);
      lVar43 = lVar43 + 2;
    } while (lVar43 != 0x10);
    pp_crypto_hash_sha2_512_process(ctx,(puint64 *)ctx);
    data = data + __n;
    len = len - __n;
  }
  for (; 0x7f < len; len = len - 0x80) {
    memcpy(ctx,data,0x80);
    lVar43 = 0;
    do {
      auVar47 = *(undefined1 (*) [16])(ctx->hash + lVar43 + -0x10);
      auVar48[8] = auVar47[8];
      auVar48[9] = 0;
      auVar48[10] = auVar47[9];
      auVar45._0_10_ = (unkuint10)auVar47[0xc] << 0x40;
      auVar45[10] = auVar47[0xd];
      auVar46[0xb] = 0;
      auVar46._0_11_ = auVar45;
      auVar46[0xc] = auVar47[0xe];
      auVar46[0xd] = 0;
      auVar46[0xe] = auVar47[0xf];
      auVar48[3] = 0;
      auVar48._0_3_ = auVar45._8_3_;
      auVar48._4_3_ = auVar46._12_3_;
      auVar48[7] = 0;
      auVar48[0xb] = 0;
      auVar48._12_3_ = (int3)(CONCAT16(auVar47[0xb],(uint6)auVar47[10] << 0x20) >> 0x20);
      auVar48[0xf] = 0;
      auVar51 = pshuflw(auVar48,auVar48,0x1b);
      auVar51 = pshufhw(auVar51,auVar51,0x1b);
      auVar21[0xd] = 0;
      auVar21._0_13_ = auVar47._0_13_;
      auVar21[0xe] = auVar47[7];
      auVar23[0xc] = auVar47[6];
      auVar23._0_12_ = auVar47._0_12_;
      auVar23._13_2_ = auVar21._13_2_;
      auVar25[0xb] = 0;
      auVar25._0_11_ = auVar47._0_11_;
      auVar25._12_3_ = auVar23._12_3_;
      auVar27[10] = auVar47[5];
      auVar27._0_10_ = auVar47._0_10_;
      auVar27._11_4_ = auVar25._11_4_;
      auVar29[9] = 0;
      auVar29._0_9_ = auVar47._0_9_;
      auVar29._10_5_ = auVar27._10_5_;
      auVar30[8] = auVar47[4];
      auVar30._0_8_ = auVar47._0_8_;
      auVar30._9_6_ = auVar29._9_6_;
      auVar44[7] = 0;
      auVar44._0_7_ = auVar30._8_7_;
      auVar36._7_8_ = 0;
      auVar36._0_7_ = auVar30._8_7_;
      auVar40._1_8_ = SUB158(auVar36 << 0x40,7);
      auVar40[0] = auVar47[3];
      auVar40._9_6_ = 0;
      auVar37._1_10_ = SUB1510(auVar40 << 0x30,5);
      auVar37[0] = auVar47[2];
      auVar41._11_4_ = 0;
      auVar41._0_11_ = auVar37;
      auVar33._3_12_ = SUB1512(auVar41 << 0x20,3);
      auVar33[2] = auVar47[1];
      auVar33[1] = 0;
      auVar33[0] = auVar47[0];
      auVar44._8_4_ = auVar33._0_4_;
      auVar44._12_4_ = auVar37._0_4_;
      auVar47 = pshuflw(auVar44,auVar44,0x1b);
      auVar47 = pshufhw(auVar47,auVar47,0x1b);
      sVar3 = auVar47._0_2_;
      sVar4 = auVar47._2_2_;
      sVar5 = auVar47._4_2_;
      sVar6 = auVar47._6_2_;
      sVar7 = auVar47._8_2_;
      sVar8 = auVar47._10_2_;
      sVar9 = auVar47._12_2_;
      sVar10 = auVar47._14_2_;
      sVar11 = auVar51._0_2_;
      sVar12 = auVar51._2_2_;
      sVar13 = auVar51._4_2_;
      sVar14 = auVar51._6_2_;
      sVar15 = auVar51._8_2_;
      sVar16 = auVar51._10_2_;
      sVar17 = auVar51._12_2_;
      sVar18 = auVar51._14_2_;
      ppVar1 = ctx->hash + lVar43 + -0x10;
      *(char *)ppVar1 = (0 < sVar3) * (sVar3 < 0x100) * auVar47[0] - (0xff < sVar3);
      *(char *)((long)ppVar1 + 1) = (0 < sVar4) * (sVar4 < 0x100) * auVar47[2] - (0xff < sVar4);
      *(char *)((long)ppVar1 + 2) = (0 < sVar5) * (sVar5 < 0x100) * auVar47[4] - (0xff < sVar5);
      *(char *)((long)ppVar1 + 3) = (0 < sVar6) * (sVar6 < 0x100) * auVar47[6] - (0xff < sVar6);
      *(char *)((long)ppVar1 + 4) = (0 < sVar7) * (sVar7 < 0x100) * auVar47[8] - (0xff < sVar7);
      *(char *)((long)ppVar1 + 5) = (0 < sVar8) * (sVar8 < 0x100) * auVar47[10] - (0xff < sVar8);
      *(char *)((long)ppVar1 + 6) = (0 < sVar9) * (sVar9 < 0x100) * auVar47[0xc] - (0xff < sVar9);
      *(char *)((long)ppVar1 + 7) = (0 < sVar10) * (sVar10 < 0x100) * auVar47[0xe] - (0xff < sVar10)
      ;
      *(char *)(ppVar1 + 1) = (0 < sVar11) * (sVar11 < 0x100) * auVar51[0] - (0xff < sVar11);
      *(char *)((long)ppVar1 + 9) = (0 < sVar12) * (sVar12 < 0x100) * auVar51[2] - (0xff < sVar12);
      *(char *)((long)ppVar1 + 10) = (0 < sVar13) * (sVar13 < 0x100) * auVar51[4] - (0xff < sVar13);
      *(char *)((long)ppVar1 + 0xb) = (0 < sVar14) * (sVar14 < 0x100) * auVar51[6] - (0xff < sVar14)
      ;
      *(char *)((long)ppVar1 + 0xc) = (0 < sVar15) * (sVar15 < 0x100) * auVar51[8] - (0xff < sVar15)
      ;
      *(char *)((long)ppVar1 + 0xd) =
           (0 < sVar16) * (sVar16 < 0x100) * auVar51[10] - (0xff < sVar16);
      *(char *)((long)ppVar1 + 0xe) =
           (0 < sVar17) * (sVar17 < 0x100) * auVar51[0xc] - (0xff < sVar17);
      *(char *)((long)ppVar1 + 0xf) =
           (0 < sVar18) * (sVar18 < 0x100) * auVar51[0xe] - (0xff < sVar18);
      lVar43 = lVar43 + 2;
    } while (lVar43 != 0x10);
    pp_crypto_hash_sha2_512_process(ctx,(puint64 *)ctx);
    data = data + 0x80;
  }
  uVar42 = 0;
LAB_00113be6:
  if (len != 0) {
    memcpy((void *)((long)ctx->hash + ((ulong)uVar42 - 0x80)),data,len);
    return;
  }
  return;
}

Assistant:

void
p_crypto_hash_sha2_512_update (PHashSHA2_512	*ctx,
			       const puchar	*data,
			       psize		len)
{
	puint32	left;
	puint32	to_fill;

	left = (puint32) (ctx->len_low & 0x7F);
	to_fill = 128 - left;

	ctx->len_low += (puint64) len;

	if (ctx->len_low < (puint64) len)
		++ctx->len_high;

	if (left && (puint64) len >= to_fill) {
		memcpy (ctx->buf.buf + left, data, to_fill);
		pp_crypto_hash_sha2_512_swap_bytes (ctx->buf.buf_w, 16);
		pp_crypto_hash_sha2_512_process (ctx, ctx->buf.buf_w);

		data += to_fill;
		len -= to_fill;
		left = 0;
	}

	while (len >= 128) {
		memcpy (ctx->buf.buf, data, 128);
		pp_crypto_hash_sha2_512_swap_bytes (ctx->buf.buf_w, 16);
		pp_crypto_hash_sha2_512_process (ctx, ctx->buf.buf_w);

		data += 128;
		len -= 128;
	}

	if (len > 0)
		memcpy (ctx->buf.buf + left, data, len);
}